

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int ffgmrm(fitsfile *gfptr,long member,int rmopt,int *status)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  long member_00;
  fitsfile *mfptr;
  int iomode;
  int hdutype;
  long groupExtver;
  long grpid;
  long ngroups;
  char *tgrplc;
  long nmembers;
  char card [81];
  char keyword [75];
  char grpLocation1 [1025];
  char grpLocation3 [1025];
  char grplc [1025];
  char grpLocation2 [1025];
  char cwd [1025];
  char grootname [1025];
  char mrootname [1025];
  fitsfile *local_1d88;
  int local_1d80 [2];
  long local_1d78;
  long local_1d70;
  long local_1d68;
  long local_1d60;
  char *local_1d58;
  long local_1d50;
  char local_1d48 [96];
  char local_1ce8 [80];
  char local_1c98 [1040];
  char local_1888 [1040];
  char local_1478 [1040];
  char local_1068 [1040];
  char local_c58 [1040];
  char local_848 [1040];
  char local_438 [1032];
  
  local_1d80[1] = 0;
  local_1d80[0] = 0;
  local_1d68 = 0;
  local_1d50 = 0;
  local_1d78 = 0;
  local_1d70 = 0;
  local_1d88 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  ffflmd(gfptr,local_1d80,status);
  if (local_1d80[0] != 1) {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *status = 0x15e;
    goto LAB_001b7b27;
  }
  iVar3 = ffgmop(gfptr,member,&local_1d88,status);
  *status = iVar3;
  iVar3 = ffflmd(local_1d88,local_1d80,status);
  *status = iVar3;
  if (rmopt == 1) {
    if (local_1d80[0] == 1) {
      iVar3 = ffgkyj(gfptr,"EXTVER",&local_1d78,local_1d48,status);
      *status = iVar3;
      ffrtnm(local_1d88->Fptr->filename,local_438,status);
      ffrtnm(gfptr->Fptr->filename,local_848,status);
      if ((local_1d88->Fptr != gfptr->Fptr) &&
         (iVar3 = strncmp(local_438,local_848,0x401), iVar3 != 0)) {
        local_1d78 = -local_1d78;
      }
      iVar3 = fits_get_url(gfptr,local_1c98,local_1068,(char *)0x0,(char *)0x0,(int *)0x0,status);
      *status = iVar3;
      if (iVar3 != 0) goto LAB_001b7b27;
      iVar3 = fits_get_cwd(local_c58,status);
      *status = iVar3;
      if (((local_1c98[0] != '\0') && (local_1c98[0] != '/')) &&
         (iVar3 = fits_is_url_absolute(local_1c98), iVar3 == 0)) {
        strcpy(local_1888,local_c58);
        sVar5 = strlen(local_1888);
        sVar6 = strlen(local_1c98);
        if (0xfffffffffffffbfe < (sVar6 + sVar5) - 0x400) {
          sVar5 = strlen(local_1888);
          (local_1888 + sVar5)[0] = '/';
          (local_1888 + sVar5)[1] = '\0';
          strcat(local_1888,local_1c98);
          fits_clean_url(local_1888,local_1c98,status);
          goto LAB_001b75e4;
        }
LAB_001b7657:
        ffpmsg("group locations are too long (ffgmrm)");
        *status = 0x7d;
        goto LAB_001b7b27;
      }
LAB_001b75e4:
      if (((local_1068[0] != '\0') && (local_1068[0] != '/')) &&
         (iVar3 = fits_is_url_absolute(local_1068), iVar3 == 0)) {
        strcpy(local_1888,local_c58);
        sVar5 = strlen(local_1888);
        sVar6 = strlen(local_1068);
        if ((sVar6 + sVar5) - 0x400 < 0xfffffffffffffbff) goto LAB_001b7657;
        sVar5 = strlen(local_1888);
        (local_1888 + sVar5)[0] = '/';
        (local_1888 + sVar5)[1] = '\0';
        strcat(local_1888,local_1068);
        fits_clean_url(local_1888,local_1068,status);
      }
      iVar3 = ffgmng(local_1d88,&local_1d68,status);
      *status = iVar3;
      iVar3 = ffgrec(local_1d88,0,local_1d48,status);
      *status = iVar3;
      local_1d60 = local_1d68;
      if (0 < local_1d68) {
        uVar8 = 0;
        uVar9 = 0;
        do {
          if (iVar3 != 0 || uVar9 != 0) break;
          uVar8 = uVar8 + 1;
          snprintf(local_1ce8,0x4b,"GRPID%d",uVar8 & 0xffffffff);
          iVar3 = ffgkyj(local_1d88,local_1ce8,&local_1d70,local_1d48,status);
          *status = iVar3;
          uVar9 = 0;
          if (iVar3 == 0) {
            if (0 < local_1d70 && local_1d70 == local_1d78) {
              iVar3 = 0;
              goto LAB_001b788b;
            }
            uVar9 = 0;
            if (local_1d70 < 0 && local_1d70 == local_1d78) {
              snprintf(local_1ce8,0x4b,"GRPLC%d",uVar8 & 0xffffffff);
              iVar3 = ffgkls(local_1d88,local_1ce8,&local_1d58,local_1d48,status);
              pcVar7 = local_1d58;
              *status = iVar3;
              if (iVar3 == 0) {
                strcpy(local_1478,local_1d58);
                free(pcVar7);
                iVar3 = *status;
              }
              if (iVar3 == 0) {
                prepare_keyvalue(local_1478);
                cVar2 = local_1478[0];
                iVar3 = 0;
                if (((local_1478[0] != '\0') &&
                    (iVar4 = fits_is_url_absolute(local_1478), cVar2 != '/')) &&
                   (iVar3 = 0, iVar4 == 0)) {
                  iVar3 = ffflnm(local_1d88,local_1888,status);
                  *status = iVar3;
                  pcVar7 = strrchr(local_1888,0x2f);
                  if (pcVar7 != (char *)0x0) {
                    *pcVar7 = '\0';
                  }
                  sVar5 = strlen(local_1888);
                  sVar6 = strlen(local_1478);
                  if ((sVar6 + sVar5) - 0x400 < 0xfffffffffffffbff) {
                    ffpmsg("group locations are too long (ffgmrm)");
                    *status = 0x7d;
                    uVar9 = 0;
                    iVar3 = 0x7d;
                    goto LAB_001b7954;
                  }
                  sVar5 = strlen(local_1888);
                  (local_1888 + sVar5)[0] = '/';
                  (local_1888 + sVar5)[1] = '\0';
                  strcat(local_1888,local_1478);
                  iVar3 = fits_clean_url(local_1888,local_1478,status);
                  *status = iVar3;
                }
                iVar4 = strcmp(local_1478,local_1c98);
                if (iVar4 != 0) {
                  iVar4 = strcmp(local_1478,local_1068);
                  uVar9 = 0;
                  if (iVar4 != 0) goto LAB_001b7954;
                }
LAB_001b788b:
                uVar9 = (uint)uVar8;
              }
              else {
                uVar9 = 0;
                if (iVar3 == 0xca) {
                  iVar3 = 0;
                  snprintf(local_1d48,0x51,"No GRPLC%d found for GRPID%d",uVar8 & 0xffffffff,
                           uVar8 & 0xffffffff);
                  ffpmsg(local_1d48);
                  *status = 0;
                  uVar9 = 0;
                }
              }
            }
            else {
              iVar3 = 0;
            }
          }
LAB_001b7954:
        } while ((long)uVar8 < local_1d60);
        if (uVar9 != 0) {
          snprintf(local_1ce8,0x4b,"GRPID%d",(ulong)uVar9);
          iVar3 = ffdkey(local_1d88,local_1ce8,status);
          *status = iVar3;
          snprintf(local_1ce8,0x4b,"GRPLC%d",(ulong)uVar9);
          ffdkey(local_1d88,local_1ce8,status);
          *status = 0;
          iVar3 = ffgmng(local_1d88,&local_1d68,status);
          *status = iVar3;
        }
      }
    }
    iVar3 = ffdrow(gfptr,member,1,status);
  }
  else {
    if (rmopt != 2) {
      *status = 0x15b;
      ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
      goto LAB_001b7b27;
    }
    iVar3 = ffghdn(local_1d88,local_1d80 + 1);
    if (iVar3 == 1) {
      *status = 0x12d;
      goto LAB_001b7b27;
    }
    iVar3 = ffgkys(local_1d88,"EXTNAME",local_1c98,local_1d48,status);
    *status = iVar3;
    if (iVar3 == 0xca) {
      local_1c98[0] = '\0';
      *status = 0;
      prepare_keyvalue(local_1c98);
    }
    else {
      prepare_keyvalue(local_1c98);
      if (iVar3 != 0) goto LAB_001b7b27;
    }
    iVar3 = fits_strcasecmp(local_1c98,"GROUPING");
    if (iVar3 == 0) {
      iVar3 = ffgtnm(local_1d88,&local_1d50,status);
      *status = iVar3;
      member_00 = local_1d50;
      if (0 < local_1d50) {
        do {
          if (iVar3 != 0) goto LAB_001b7b27;
          iVar3 = ffgmrm(local_1d88,member_00,1,status);
          *status = iVar3;
          bVar1 = 1 < member_00;
          member_00 = member_00 + -1;
        } while (bVar1);
      }
      if (iVar3 != 0) goto LAB_001b7b27;
    }
    iVar3 = ffgmul(local_1d88,0,status);
    *status = iVar3;
    if ((iVar3 != 0) || (ffrdef(gfptr,status), local_1d80[0] == 0)) goto LAB_001b7b27;
    iVar3 = ffdhdu(local_1d88,local_1d80 + 1,status);
  }
  *status = iVar3;
LAB_001b7b27:
  if (local_1d88 != (fitsfile *)0x0) {
    ffclos(local_1d88,status);
  }
  return *status;
}

Assistant:

int ffgmrm(fitsfile *gfptr,  /* FITS file pointer to group table             */
	   long      member, /* member ID (row num) in the group             */
	   int       rmopt,  /* code specifying the delete option:
				OPT_RM_ENTRY ==> delete the member entry
				OPT_RM_MBR   ==> delete entry and member HDU */
	   int      *status)  /* return status code                          */

/*
  remove a member HDU from a grouping table. The fitsfile pointer gfptr must
  be positioned with the grouping table as the CHDU, and the member to 
  delete is identified by its row number in the table (first member == 1).
  The rmopt parameter determines if the member entry is deleted from the
  grouping table (in which case GRPIDn and GRPLCn keywords in the member 
  HDU's header shall be updated accordingly) or if the member HDU shall 
  itself be removed from its FITS file.
*/

{
  int found;
  int hdutype   = 0;
  int index;
  int iomode    = 0;

  long i;
  long ngroups      = 0;
  long nmembers     = 0;
  long groupExtver  = 0;
  long grpid        = 0;

  char grpLocation1[FLEN_FILENAME];
  char grpLocation2[FLEN_FILENAME];
  char grpLocation3[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];
  char keyword[FLEN_KEYWORD];
  /* SPR 1738 This can now be longer */
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char *editLocation;
  char mrootname[FLEN_FILENAME], grootname[FLEN_FILENAME];

  fitsfile *mfptr  = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_DETACH;
	  continue;
	}

      /* open the group member to be deleted and get its IOstatus*/

      *status = fits_open_member(gfptr,member,&mfptr,status);
      *status = fits_file_mode(mfptr,&iomode,status);

      /*
	 if the member HDU is to be deleted then call fits_unlink_member()
	 to remove it from all groups to which it belongs (including
	 this one) and then delete it. Note that if the member is a
	 grouping table then we have to recursively call fits_remove_member()
	 for each member of the member before we delete the member itself.
      */

      if(rmopt == OPT_RM_MBR)
	{
	    /* cannot delete a PHDU */
	    if(fits_get_hdu_num(mfptr,&hdutype) == 1)
		{
		    *status = BAD_HDU_NUM;
		    continue;
		}

	  /* determine if the member HDU is itself a grouping table */

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,status);

	  /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

	  if(*status == KEY_NO_EXIST) 
	    {
	      keyvalue[0] = 0;
	      *status = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  /* Any other error is a reason to abort */

	  if(*status != 0) continue;

	  /* if the EXTNAME == GROUPING then the member is a grouping table */
	  
	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* remove each of the grouping table members */
	      
	      *status = fits_get_num_members(mfptr,&nmembers,status);
	      
	      for(i = nmembers; i > 0 && *status == 0; --i)
		*status = fits_remove_member(mfptr,i,OPT_RM_ENTRY,status);
	      
	      if(*status != 0) continue;
	    }

	  /* unlink the member HDU from all groups that contain it */

	  *status = ffgmul(mfptr,0,status);

	  if(*status != 0) continue;
 
	  /* reset the grouping table HDU struct */

	  fits_set_hdustruc(gfptr,status);

	  /* delete the member HDU */

	  if(iomode != READONLY)
	    *status = fits_delete_hdu(mfptr,&hdutype,status);
	}
      else if(rmopt == OPT_RM_ENTRY)
	{
	  /* 
	     The member HDU is only to be removed as an entry from this
	     grouping table. Actions are (1) find the GRPIDn/GRPLCn 
	     keywords that link the member to the grouping table, (2)
	     remove the GRPIDn/GRPLCn keyword from the member HDU header
	     and (3) remove the member entry from the grouping table
	  */

	  /*
	    there is no need to seach for and remove the GRPIDn/GRPLCn
	    keywords from the member HDU if it has not been opened
	    in READWRITE mode
	  */

	  if(iomode == READWRITE)
	    {	  	      
	      /* 
		 determine the group EXTVER value of the grouping table; if
		 the member HDU and grouping table HDU do not reside in the 
		 same file then set the groupExtver value to its negative 
	      */
	      
	      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,
					  status);
	      /* Now, if either the Fptr values are the same, or the root filenames
	         are the same, then assume these refer to the same file.
	      */
	      fits_parse_rootname(mfptr->Fptr->filename, mrootname, status);
	      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	      if((mfptr->Fptr != gfptr->Fptr) && 
	          strncmp(mrootname, grootname, FLEN_FILENAME))
                       groupExtver = -1*groupExtver;
	      
	      /*
		retrieve the URLs for the grouping table; note that it is 
		possible that the grouping table file has two URLs, the 
		one used to open it and the "real" one pointing to the 
		actual file being accessed
	      */
	      
	      *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,
				     NULL,NULL,status);
	      
	      if(*status != 0) continue;
	      
	      /*
		if either of the group location strings specify a relative
		file path then convert them into absolute file paths
	      */

	      *status = fits_get_cwd(cwd,status);
	      
	      if(*grpLocation1 != 0 && *grpLocation1 != '/' &&
		 !fits_is_url_absolute(grpLocation1))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation1);
		  fits_clean_url(grpLocation3,grpLocation1,status);
		}
	      
	      if(*grpLocation2 != 0 && *grpLocation2 != '/' &&
		 !fits_is_url_absolute(grpLocation2))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation2);
		  fits_clean_url(grpLocation3,grpLocation2,status);
		}
	      
	      /*
		determine the number of groups to which the member HDU 
		belongs
	      */
	      
	      *status = fits_get_num_groups(mfptr,&ngroups,status);
	      
	      /* reset the HDU keyword position counter to the beginning */
	      
	      *status = ffgrec(mfptr,0,card,status);
	      
	      /*
		loop over all the GRPIDn keywords in the member HDU header 
		and find the appropriate GRPIDn and GRPLCn keywords that 
		identify it as belonging to the group
	      */
	      
	      for(index = 1, found = 0; index <= ngroups && *status == 0 && 
		    !found; ++index)
		{	  
		  /* read the next GRPIDn keyword in the series */
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);
		  
		  *status = fits_read_key_lng(mfptr,keyword,&grpid,card,
					      status);
		  if(*status != 0) continue;
		  
		  /* 
		     grpid value == group EXTVER value then we could have a 
		     match
		  */
		  
		  if(grpid == groupExtver && grpid > 0)
		    {
		      /*
			if GRPID is positive then its a match because 
			both the member HDU and grouping table HDU reside
			in the same FITS file
		      */
		      
		      found = index;
		    }
		  else if(grpid == groupExtver && grpid < 0)
		    {
		      /* 
			 have to look at the GRPLCn value to determine a 
			 match because the member HDU and grouping table 
			 HDU reside in different FITS files
		      */
		      
		      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
		      
		      /* SPR 1738 */
		      *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,
						      card, status);
		      if (0 == *status) {
			strcpy(grplc,tgrplc);
			free(tgrplc);
		      }
		      		      
		      if(*status == KEY_NO_EXIST)
			{
			  /* 
			     no GRPLCn keyword value found ==> grouping
			     convention not followed; nothing we can do 
			     about it, so just continue
			  */
			  
			  snprintf(card,FLEN_CARD,"No GRPLC%d found for GRPID%d",
				  index,index);
			  ffpmsg(card);
			  *status = 0;
			  continue;
			}
		      else if (*status != 0) continue;
		      
		      /* construct the URL for the GRPLCn value */
		      
		      prepare_keyvalue(grplc);
		      
		      /*
			if the grplc value specifies a relative path then
			turn it into a absolute file path for comparison
			purposes
		      */
		      
		      if(*grplc != 0 && !fits_is_url_absolute(grplc) &&
			 *grplc != '/')
			{
			    /* No, wrong, 
			       strcpy(grpLocation3,cwd);
			       should be */
			    *status = fits_file_name(mfptr,grpLocation3,status);
			    /* Remove everything after the last / */
			    if (NULL != (editLocation = strrchr(grpLocation3,'/'))) {
				*editLocation = '\0';
			    }
				
                          if (strlen(grpLocation3)+strlen(grplc)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("group locations are too long (ffgmrm)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(grpLocation3,"/");
			  strcat(grpLocation3,grplc);
			  *status = fits_clean_url(grpLocation3,grplc,
						   status);
			}
		      
		      /*
			if the absolute value of GRPIDn is equal to the
			EXTVER value of the grouping table and (one of the 
			possible two) grouping table file URL matches the
			GRPLCn keyword value then we hava a match
		      */
		      
		      if(strcmp(grplc,grpLocation1) == 0  || 
			 strcmp(grplc,grpLocation2) == 0) 
			found = index; 
		    }
		}

	      /*
		if found == 0 (false) after the above search then we assume 
		that it is due to an inpromper updating of the GRPIDn and 
		GRPLCn keywords in the member header ==> nothing to delete 
		in the header. Else delete the GRPLCn and GRPIDn keywords 
		that identify the member HDU with the group HDU and 
		re-enumerate the remaining GRPIDn and GRPLCn keywords
	      */

	      if(found != 0)
		{
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  *status = 0;
		  
		  /* call fits_get_num_groups() to re-enumerate the GRPIDn */
		  
		  *status = fits_get_num_groups(mfptr,&ngroups,status);
		} 
	    }

	  /*
	     finally, remove the member entry from the current grouping table
	     pointed to by gfptr
	  */

	  *status = fits_delete_rows(gfptr,member,1,status);
	}
      else
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}